

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeQuad>::Solution
          (TPZCompElHDiv<pzshape::TPZShapeQuad> *this,TPZVec<double> *qsi,int var,
          TPZVec<double> *sol)

{
  TPZMaterialDataT<double> data;
  TPZMaterialDataT<double> local_8250;
  
  if (var == 99) {
    TPZInterpolationSpace::SolutionInternal<double>((TPZInterpolationSpace *)this,qsi,99,sol);
    return;
  }
  TPZMaterialDataT<double>::TPZMaterialDataT(&local_8250);
  TPZInterpolationSpace::ComputeSolution((TPZInterpolationSpace *)this,qsi,&local_8250,false);
  TPZVec<double>::operator=
            (sol,&(local_8250.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->
                  super_TPZVec<double>);
  local_8250.super_TPZMaterialData.super_TPZShapeData._0_8_ = &PTR__TPZMaterialDataT_018e86d8;
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8250 + 0x7950));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8250 + 0x7070));
  TPZManVector<TPZFNMatrix<30,_double>,_20>::~TPZManVector
            ((TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&local_8250 + 0x51b0));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8250 + 0x48d0));
  TPZMaterialData::~TPZMaterialData(&local_8250.super_TPZMaterialData,&PTR_PTR_018e8740);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>:: Solution(TPZVec<REAL> &qsi,int var,TPZVec<STATE> &sol)
{
    //TODOCOMPLEX
    if (var == 99) {
        return TPZIntelGen<TSHAPE>::Solution(qsi,var,sol);
    }
    TPZMaterialDataT<STATE> data;
    constexpr bool hasPhi{false};
    this->ComputeSolution(qsi,data,hasPhi);
    sol = std::move(data.sol[0]);
}